

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogDeserializer::WriteAheadLogDeserializer
          (WriteAheadLogDeserializer *this,ReplayState *state_p,
          unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> *data_p,idx_t size
          ,bool deserialize_only)

{
  this->state = state_p;
  this->db = state_p->db;
  this->context = state_p->context;
  this->catalog = state_p->catalog;
  (this->data).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (data_p->super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (data_p->super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  MemoryStream::MemoryStream
            (&this->stream,
             (this->data).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
             _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,size);
  BinaryDeserializer::BinaryDeserializer(&this->deserializer,&(this->stream).super_ReadStream);
  this->deserialize_only = deserialize_only;
  ::std::
  deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
  ::emplace_back<duckdb::Catalog&>
            ((deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
              *)&(this->deserializer).super_Deserializer.data.catalogs,this->catalog);
  return;
}

Assistant:

WriteAheadLogDeserializer(ReplayState &state_p, unique_ptr<data_t[]> data_p, idx_t size,
	                          bool deserialize_only = false)
	    : state(state_p), db(state.db), context(state.context), catalog(state.catalog), data(std::move(data_p)),
	      stream(data.get(), size), deserializer(stream), deserialize_only(deserialize_only) {
		deserializer.Set<Catalog &>(catalog);
	}